

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

tensor * __thiscall sub::forward(sub *this,vector<tensor_*,_std::allocator<tensor_*>_> *x)

{
  pointer pptVar1;
  tensor *ptVar2;
  tensor *ptVar3;
  pointer pdVar4;
  tensor *ptVar5;
  
  (this->super_node).isbuild = true;
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->super_node).grad_fn,
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(x->super__Vector_base<tensor_*,_std::allocator<tensor_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<tensor_*,_std::allocator<tensor_*>_>::operator=(&(this->super_node).input,x);
  ptVar5 = (tensor *)operator_new(0x20);
  ptVar5->data = 0.0;
  ptVar5->grad = 0.0;
  ptVar5->cnt = 0;
  ptVar5->cnt_free = 0;
  ptVar5->hook = (node *)0x0;
  tensor::tensor_cnt = tensor::tensor_cnt + 1;
  (this->super_node).ret = ptVar5;
  pptVar1 = (this->super_node).input.super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ptVar2 = *pptVar1;
  ptVar3 = pptVar1[1];
  ptVar5->data = ptVar2->data - ptVar3->data;
  pdVar4 = (this->super_node).grad_fn.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pdVar4 = 1.0;
  pdVar4[1] = -1.0;
  ptVar2->cnt = ptVar2->cnt + 1;
  ptVar2->cnt_free = ptVar2->cnt_free + 1;
  ptVar3->cnt = ptVar3->cnt + 1;
  ptVar3->cnt_free = ptVar3->cnt_free + 1;
  ptVar5->hook = &this->super_node;
  return ptVar5;
}

Assistant:

tensor* forward(vector<tensor *> x){
        isbuild=true;
        grad_fn.resize(x.size());
        input = x;
        ret = new tensor();
        ret->data = input[0]->data-input[1]->data;
        grad_fn[0]=1;
        grad_fn[1]=-1;
        input[0]->cnt++;
        input[0]->cnt_free++;
        input[1]->cnt++;
        input[1]->cnt_free++;
        ret->hook=this;
        return ret;
    }